

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_builder.c
# Opt level: O2

void ensure_cell_count(ErrorList *errors,TableRows *rows,TableRow *header,AstNode *ast_node)

{
  wchar_t wVar1;
  Location_conflict location;
  wchar_t wVar2;
  TableRow *pTVar3;
  long lVar4;
  long lVar5;
  
  if (rows != (TableRows *)0x0) {
    wVar2 = rows->row_count;
    if (wVar2 != L'\0') {
      pTVar3 = header;
      if (header == (TableRow *)0x0) {
        pTVar3 = rows->table_rows;
      }
      wVar1 = pTVar3->table_cells->cell_count;
      lVar4 = 0x20;
      for (lVar5 = 0; lVar5 < wVar2; lVar5 = lVar5 + 1) {
        if (**(wchar_t **)((long)&rows->table_rows->row_delete + lVar4) != wVar1) {
          location = *(Location_conflict *)((long)rows->table_rows + lVar4 + -0x14);
          TableRow_delete(header);
          TableRows_delete(rows);
          AstNode_delete(ast_node);
          ErrorList_add_inconsisten_cell_count_error(errors,location);
          wVar2 = rows->row_count;
        }
        lVar4 = lVar4 + 0x28;
      }
    }
  }
  return;
}

Assistant:

static void ensure_cell_count(ErrorList* errors, const TableRows* rows, const TableRow* header, AstNode* ast_node) {
    if (!rows || rows->row_count == 0) {
        return;
    }
    int cell_count = header ? header->table_cells->cell_count : rows->table_rows[0].table_cells->cell_count;
    int i;
    for (i = 0; i < rows->row_count; ++i) {
        if (rows->table_rows[i].table_cells->cell_count != cell_count) {
            Location error_location = {rows->table_rows[i].location.line, rows->table_rows[i].location.column};
            TableRow_delete(header);
            TableRows_delete(rows);
            AstNode_delete(ast_node);
            ErrorList_add_inconsisten_cell_count_error(errors, error_location);
        }
    }
}